

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O2

void __thiscall
QSynth::setDisplayCompatibilityMode
          (QSynth *this,DisplayCompatibilityMode useDisplayCompatibilityMode)

{
  Synth *this_00;
  bool oldMT32CompatibilityEnabled;
  QMutexLocker<QMutex> synthLocker;
  QMutexLocker<QMutex> local_20;
  
  if (this->realtimeHelper != (RealtimeHelper *)0x0) {
    RealtimeHelper::setDisplayCompatibilityMode(this->realtimeHelper,useDisplayCompatibilityMode);
    return;
  }
  QMutexLocker<QMutex>::QMutexLocker(&local_20,this->synthMutex);
  this->displayCompatibilityMode = useDisplayCompatibilityMode;
  this_00 = this->synth;
  if (useDisplayCompatibilityMode == DisplayCompatibilityMode_DEFAULT) {
    oldMT32CompatibilityEnabled = MT32Emu::Synth::isDefaultDisplayOldMT32Compatible(this_00);
  }
  else {
    oldMT32CompatibilityEnabled = useDisplayCompatibilityMode == DisplayCompatibilityMode_OLD_MT32;
  }
  MT32Emu::Synth::setDisplayCompatibility(this_00,oldMT32CompatibilityEnabled);
  QMutexLocker<QMutex>::unlock(&local_20);
  return;
}

Assistant:

void QSynth::setDisplayCompatibilityMode(DisplayCompatibilityMode useDisplayCompatibilityMode) {
	if (isRealtime()) {
		realtimeHelper->setDisplayCompatibilityMode(useDisplayCompatibilityMode);
	} else {
		QMutexLocker synthLocker(synthMutex);
		displayCompatibilityMode = useDisplayCompatibilityMode;
		if (DisplayCompatibilityMode_DEFAULT == displayCompatibilityMode) {
			synth->setDisplayCompatibility(synth->isDefaultDisplayOldMT32Compatible());
		} else {
			synth->setDisplayCompatibility(DisplayCompatibilityMode_OLD_MT32 == displayCompatibilityMode);
		}
	}
}